

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anandan.c
# Opt level: O2

void dump_flow(qnode_ptr_t *h,qnode_ptr_t *q,char *f,float div)

{
  undefined4 in_XMM0_Db;
  
  write_velocity(f,*q,SUB84((double)(float)(double)CONCAT44(in_XMM0_Db,div),0));
  return;
}

Assistant:

void dump_flow(h,q,f,div)
qnode_ptr_t *h, *q ;
char *f ;
float div ;
{
    qnode_ptr_t t ;

  /* while (*q != (qnode_ptr_t)NULL) {
    t = *q ;
    itoa(t->level,s) ;
    concat(f,s,fname) ;
    write_velocity(fname,t,div) ;
    dealloc_flow(t) ;
    dealloc_param(t) ;
    delete_node(t,h,q) ;
  } */
  t = *q ;
  write_velocity(f,t,div) ;
}